

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawpagetexture.cpp
# Opt level: O0

BYTE * __thiscall FRawPageTexture::GetColumn(FRawPageTexture *this,uint column,Span **spans_out)

{
  Span **spans_out_local;
  uint column_local;
  FRawPageTexture *this_local;
  
  if (this->Pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  spans_out_local._4_4_ = column;
  if ((this->super_FTexture).Width <= column) {
    spans_out_local._4_4_ = column % 0x140;
  }
  if (spans_out != (Span **)0x0) {
    *spans_out = DummySpans;
  }
  return this->Pixels + spans_out_local._4_4_ * (this->super_FTexture).Height;
}

Assistant:

const BYTE *FRawPageTexture::GetColumn (unsigned int column, const Span **spans_out)
{
	if (Pixels == NULL)
	{
		MakeTexture ();
	}
	if ((unsigned)column >= (unsigned)Width)
	{
		column %= 320;
	}
	if (spans_out != NULL)
	{
		*spans_out = DummySpans;
	}
	return Pixels + column*Height;
}